

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_def_io.c
# Opt level: O1

int32 model_def_write(model_def_t *mdef,char *fn)

{
  char **ppcVar1;
  acmod_set_t *paVar2;
  uint32 uVar3;
  uint32 uVar4;
  int32 iVar5;
  FILE *__stream;
  char *pcVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  model_def_entry_t *pmVar10;
  ulong uVar11;
  ulong uVar12;
  word_posn_t wp;
  acmod_id_t r;
  acmod_id_t l;
  acmod_id_t b;
  acmod_set_t *local_40;
  ulong local_38;
  
  __stream = fopen(fn,"w");
  if (__stream == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                   ,0x124,"Unable to open %s for writing",fn);
    iVar5 = -1;
  }
  else {
    paVar2 = mdef->acmod_set;
    uVar11 = 0;
    fprintf(__stream,"%s\n","0.3");
    uVar3 = acmod_set_n_ci(paVar2);
    fprintf(__stream,"%u n_base\n",(ulong)uVar3);
    uVar4 = acmod_set_n_multi(paVar2);
    fprintf(__stream,"%u n_tri\n",(ulong)uVar4);
    fprintf(__stream,"%u n_state_map\n",(ulong)mdef->n_total_state);
    fprintf(__stream,"%u n_tied_state\n",(ulong)mdef->n_tied_state);
    fprintf(__stream,"%u n_tied_ci_state\n",(ulong)mdef->n_tied_ci_state);
    fprintf(__stream,"%u n_tied_tmat\n",(ulong)mdef->n_tied_tmat);
    fwrite("#\n# Columns definitions\n",0x18,1,__stream);
    fprintf(__stream,"#%4s %3s %3s %1s %6s %4s %s\n","base","lft","rt","p","attrib","tmat",
            "     ... state id\'s ...");
    local_40 = paVar2;
    uVar4 = acmod_set_n_acmod(paVar2);
    if (uVar3 != 0) {
      local_38 = (ulong)uVar3;
      uVar11 = 0;
      do {
        paVar2 = local_40;
        pcVar6 = acmod_set_id2name(local_40,(acmod_id_t)uVar11);
        fprintf(__stream,"%5s %3s %3s %1s",pcVar6,"-","-","-");
        ppcVar7 = acmod_set_attrib(paVar2,(acmod_id_t)uVar11);
        if ((ppcVar7 == (char **)0x0) || (*ppcVar7 == (char *)0x0)) {
          fprintf(__stream," %6s","n/a");
        }
        else {
          fprintf(__stream," %6s");
          if (ppcVar7[1] != (char *)0x0) {
            uVar12 = 2;
            do {
              fprintf(__stream,",%s");
              ppcVar1 = ppcVar7 + uVar12;
              uVar12 = (ulong)((int)uVar12 + 1);
            } while (*ppcVar1 != (char *)0x0);
          }
        }
        fprintf(__stream," %4d",(ulong)mdef->defn[uVar11].tmat);
        pmVar10 = mdef->defn;
        if (pmVar10[uVar11].n_state != 0) {
          uVar12 = 0;
          do {
            if (pmVar10[uVar11].state[uVar12] == 0xffffffff) {
              fwrite(" N",2,1,__stream);
            }
            else {
              fprintf(__stream," %6u");
            }
            uVar12 = uVar12 + 1;
            pmVar10 = mdef->defn;
          } while (uVar12 < pmVar10[uVar11].n_state);
        }
        fputc(10,__stream);
        uVar11 = uVar11 + 1;
      } while (uVar11 != local_38);
    }
    if ((uint)uVar11 < uVar4) {
      uVar11 = uVar11 & 0xffffffff;
      do {
        paVar2 = local_40;
        acmod_set_id2tri(local_40,&b,&l,&r,&wp,(acmod_id_t)uVar11);
        pcVar6 = acmod_set_id2name(paVar2,b);
        pcVar8 = acmod_set_id2name(paVar2,l);
        pcVar9 = acmod_set_id2name(paVar2,r);
        fprintf(__stream,"%5s %3s %3s %c",pcVar6,pcVar8,pcVar9,(ulong)(uint)(int)"besiu"[wp]);
        ppcVar7 = acmod_set_attrib(paVar2,(acmod_id_t)uVar11);
        if ((ppcVar7 == (char **)0x0) || (*ppcVar7 == (char *)0x0)) {
          fprintf(__stream," %6s","n/a");
        }
        else {
          fprintf(__stream," %6s");
          if (ppcVar7[1] != (char *)0x0) {
            uVar12 = 2;
            do {
              fprintf(__stream,",%s");
              ppcVar1 = ppcVar7 + uVar12;
              uVar12 = (ulong)((int)uVar12 + 1);
            } while (*ppcVar1 != (char *)0x0);
          }
        }
        fprintf(__stream," %4d",(ulong)mdef->defn[uVar11].tmat);
        pmVar10 = mdef->defn;
        if (pmVar10[uVar11].n_state != 0) {
          uVar12 = 0;
          do {
            if (pmVar10[uVar11].state[uVar12] == 0xffffffff) {
              fwrite(" N",2,1,__stream);
            }
            else {
              fprintf(__stream," %6u");
            }
            uVar12 = uVar12 + 1;
            pmVar10 = mdef->defn;
          } while (uVar12 < pmVar10[uVar11].n_state);
        }
        fputc(10,__stream);
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar4);
    }
    fclose(__stream);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int32
model_def_write(model_def_t *mdef,
		const char *fn)
{
    FILE *fp;
    uint32 n_ci;
    uint32 n_acmod;
    acmod_set_t *acmod_set;
    const char **attrib;
    acmod_id_t b;
    acmod_id_t l;
    acmod_id_t r;
    word_posn_t wp;
    uint32 p;
    char *wp2c = WORD_POSN_CHAR_MAP;
    uint32 i;

    fp = fopen(fn, "w");
    if (fp == NULL) {
	E_ERROR_SYSTEM("Unable to open %s for writing", fn);
	return S3_ERROR;
    }

    acmod_set = mdef->acmod_set;

    fprintf(fp, "%s\n", MODEL_DEF_VERSION);
    n_ci = acmod_set_n_ci(acmod_set);
    fprintf(fp, "%u n_base\n", n_ci);
    fprintf(fp, "%u n_tri\n", acmod_set_n_multi(acmod_set));
    fprintf(fp, "%u n_state_map\n", mdef->n_total_state);
    fprintf(fp, "%u n_tied_state\n", mdef->n_tied_state);
    fprintf(fp, "%u n_tied_ci_state\n", mdef->n_tied_ci_state);
    fprintf(fp, "%u n_tied_tmat\n", mdef->n_tied_tmat);
    fprintf(fp, "#\n# Columns definitions\n");
    fprintf(fp, "#%4s %3s %3s %1s %6s %4s %s\n",
	    "base", "lft", "rt", "p", "attrib", "tmat",
	    "     ... state id's ...");

    n_acmod = acmod_set_n_acmod(acmod_set);
    for (p = 0; p < n_ci; p++) {
	fprintf(fp, "%5s %3s %3s %1s",
		acmod_set_id2name(acmod_set, p),
		"-", "-", "-");

	attrib = acmod_set_attrib(acmod_set, p);
	if ((attrib == NULL) || (attrib[0] == NULL)) {
	    fprintf(fp, " %6s", "n/a");
	}
	else {
	    fprintf(fp, " %6s", attrib[0]);

	    for (i = 1; attrib[i]; i++) {
		fprintf(fp, ",%s", attrib[i]);
	    }
	}
	fprintf(fp, " %4d", mdef->defn[p].tmat);

	for (i = 0; i < mdef->defn[p].n_state; i++) {
	    if (mdef->defn[p].state[i] == NO_ID) {
		fprintf(fp, " N");
	    }
	    else {
		fprintf(fp, " %6u", mdef->defn[p].state[i]);
	    }
	}
	fprintf(fp, "\n");
    }

    for (; p < n_acmod; p++) {
	acmod_set_id2tri(acmod_set,
			 &b, &l, &r, &wp,
			 p);
	
	fprintf(fp, "%5s %3s %3s %c",
		acmod_set_id2name(acmod_set, b),
		acmod_set_id2name(acmod_set, l),
		acmod_set_id2name(acmod_set, r),
		wp2c[(uint32)wp]);

	attrib = acmod_set_attrib(acmod_set, p);
	if ((attrib == NULL) || (attrib[0] == NULL)) {
	    fprintf(fp, " %6s", "n/a");
	}
	else {
	    fprintf(fp, " %6s", attrib[0]);

	    for (i = 1; attrib[i]; i++) {
		fprintf(fp, ",%s", attrib[i]);
	    }
	}
	fprintf(fp, " %4d", mdef->defn[p].tmat);

	for (i = 0; i < mdef->defn[p].n_state; i++) {
	    if (mdef->defn[p].state[i] == NO_ID) {
		fprintf(fp, " N");
	    }
	    else {
		fprintf(fp, " %6u", mdef->defn[p].state[i]);
	    }
	}
	fprintf(fp, "\n");
    }

    fclose(fp);

    return S3_SUCCESS;
}